

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::Field::ByteSizeLong(Field *this)

{
  long lVar1;
  Rep *pRVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  void **ppvVar10;
  
  sVar9 = (size_t)(this->options_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->options_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (sVar9 != 0) {
    lVar1 = sVar9 * 8;
    lVar8 = 0;
    do {
      sVar6 = Option::ByteSizeLong(*(Option **)((long)ppvVar10 + lVar8));
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar9 = sVar9 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar1 - lVar8 != 0);
  }
  sVar3 = ((this->name_).ptr_)->_M_string_length;
  if (sVar3 != 0) {
    uVar5 = (uint)sVar3 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = ((this->type_url_).ptr_)->_M_string_length;
  if (sVar3 != 0) {
    uVar5 = (uint)sVar3 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = ((this->json_name_).ptr_)->_M_string_length;
  if (sVar3 != 0) {
    uVar5 = (uint)sVar3 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = ((this->default_value_).ptr_)->_M_string_length;
  if (sVar3 != 0) {
    uVar5 = (uint)sVar3 | 1;
    iVar4 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar9 = sVar9 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  uVar5 = this->kind_;
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar4 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  uVar5 = this->cardinality_;
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar4 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  uVar5 = this->number_;
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar4 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  uVar5 = this->oneof_index_;
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar4 = 0x1f;
      if ((uVar5 | 1) != 0) {
        for (; (uVar5 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar7 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
    }
    sVar9 = sVar9 + uVar7;
  }
  sVar6 = sVar9 + 2;
  if (this->packed_ == false) {
    sVar6 = sVar9;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar6;
    return sVar6;
  }
  sVar9 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar6,
                     &this->_cached_size_);
  return sVar9;
}

Assistant:

size_t Field::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Field)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.Option options = 9;
  total_size += 1UL * this->_internal_options_size();
  for (const auto& msg : this->options_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string name = 4;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());
  }

  // string type_url = 6;
  if (this->type_url().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_type_url());
  }

  // string json_name = 10;
  if (this->json_name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_json_name());
  }

  // string default_value = 11;
  if (this->default_value().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_default_value());
  }

  // .google.protobuf.Field.Kind kind = 1;
  if (this->kind() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_kind());
  }

  // .google.protobuf.Field.Cardinality cardinality = 2;
  if (this->cardinality() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_cardinality());
  }

  // int32 number = 3;
  if (this->number() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_number());
  }

  // int32 oneof_index = 7;
  if (this->oneof_index() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_oneof_index());
  }

  // bool packed = 8;
  if (this->packed() != 0) {
    total_size += 1 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}